

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::dh_key_exchange::compute_secret(dh_key_exchange *this,key_t *remote_pubkey)

{
  hasher *this_00;
  long lVar1;
  type *ptVar2;
  key_t *pkVar3;
  number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  byte bVar4;
  span<const_char> data;
  span<const_char> data_00;
  hasher hStack_a8;
  sha1_hash local_9c;
  array<char,_96UL> buffer;
  
  bVar4 = 0;
  boost::multiprecision::
  powm<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>>
            ((type *)&buffer,(multiprecision *)remote_pubkey,&this->m_dh_local_secret,
             (number<boost::multiprecision::backends::cpp_int_backend<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)(anonymous_namespace)::dh_prime,in_R8);
  ptVar2 = (type *)&buffer;
  pkVar3 = &this->m_dh_shared_secret;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pkVar3->m_backend).
    super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[0] =
         (ptVar2->m_backend).
         super_cpp_int_base<768U,_768U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
         .m_wrapper.m_data[0];
    ptVar2 = (type *)((long)ptVar2 + (ulong)bVar4 * -0x10 + 8);
    pkVar3 = (key_t *)((long)pkVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  boost::multiprecision::
  export_bits<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char*>
            (&this->m_dh_shared_secret,(uchar *)&buffer,8,true);
  data.m_len = 4;
  data.m_ptr = "req3";
  lcrypto::hasher::hasher(&hStack_a8,data);
  data_00.m_len = 0x60;
  data_00.m_ptr = buffer._M_elems;
  this_00 = lcrypto::hasher::update(&hStack_a8,data_00);
  lcrypto::hasher::final(&local_9c,this_00);
  (this->m_xor_mask).m_number._M_elems[4] = local_9c.m_number._M_elems[4];
  *(undefined8 *)(this->m_xor_mask).m_number._M_elems = local_9c.m_number._M_elems._0_8_;
  *(undefined8 *)((this->m_xor_mask).m_number._M_elems + 2) = local_9c.m_number._M_elems._8_8_;
  lcrypto::hasher::~hasher(&hStack_a8);
  return;
}

Assistant:

void dh_key_exchange::compute_secret(key_t const& remote_pubkey)
	{
		// shared_secret = (remote_pubkey ^ local_secret) % prime
		m_dh_shared_secret = mp::powm(remote_pubkey, m_dh_local_secret, dh_prime);

		std::array<char, 96> buffer;
		mp::export_bits(m_dh_shared_secret, reinterpret_cast<std::uint8_t*>(buffer.data()), 8);

		static char const req3[4] = {'r', 'e', 'q', '3'};
		// calculate the xor mask for the obfuscated hash
		m_xor_mask = hasher(req3).update(buffer).final();
	}